

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void duckdb::Node::TransformToDeprecated
               (ART *art,Node *node,
               unsafe_unique_ptr<FixedSizeAllocator> *deprecated_prefix_allocator)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  NType value;
  bool bVar2;
  type paVar3;
  pointer pFVar4;
  data_ptr_t pdVar5;
  long *plVar6;
  InternalException *this;
  __hash_code __code;
  long *plVar7;
  uint uVar8;
  Node *pNVar9;
  byte *pbVar10;
  idx_t i;
  ulong uVar11;
  Node *node_00;
  long lVar12;
  string local_70;
  string local_50;
  
  uVar11 = (node->super_IndexPointer).data;
  if (-1 < (long)uVar11) {
    value = (NType)(uVar11 >> 0x38);
    uVar8 = (uint)(uVar11 >> 0x20);
    switch(value) {
    case PREFIX:
      Prefix::TransformToDeprecated(art,node,deprecated_prefix_allocator);
      return;
    case LEAF:
    case LEAF_INLINED:
      break;
    case NODE_4:
      paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar3->_M_elems[2].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar11 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar7 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar7[1]; plVar7 = (long *)*plVar7) {
        plVar6 = plVar7;
      }
      lVar12 = *plVar6;
      pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(lVar12 + 0x10));
      bVar2 = BufferHandle::IsValid(&pFVar4->buffer_handle);
      if (bVar2) {
        pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)(lVar12 + 0x10));
        pdVar5 = FixedSizeBuffer::Get(pFVar4,true);
        pNVar9 = (Node *)(pdVar5 + (_Var1._M_head_impl)->bitmask_offset +
                                   (ulong)(uVar8 & 0xffffff) * (_Var1._M_head_impl)->segment_size);
      }
      else {
        pNVar9 = (Node *)0x0;
      }
      if ((pNVar9 != (Node *)0x0) && ((data_t)(pNVar9->super_IndexPointer).data != '\0')) {
        uVar11 = 0;
        node_00 = pNVar9;
        do {
          node_00 = node_00 + 1;
          TransformToDeprecated(art,node_00,deprecated_prefix_allocator);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (byte)(pNVar9->super_IndexPointer).data);
      }
      break;
    case NODE_16:
      paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar3->_M_elems[3].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar11 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar7 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar7[1]; plVar7 = (long *)*plVar7) {
        plVar6 = plVar7;
      }
      lVar12 = *plVar6;
      pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(lVar12 + 0x10));
      bVar2 = BufferHandle::IsValid(&pFVar4->buffer_handle);
      if (bVar2) {
        pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)(lVar12 + 0x10));
        pdVar5 = FixedSizeBuffer::Get(pFVar4,true);
        pbVar10 = pdVar5 + (_Var1._M_head_impl)->bitmask_offset +
                           (ulong)(uVar8 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
      }
      else {
        pbVar10 = (byte *)0x0;
      }
      if ((pbVar10 != (byte *)0x0) && (*pbVar10 != 0)) {
        pNVar9 = (Node *)(pbVar10 + 0x18);
        uVar11 = 0;
        do {
          TransformToDeprecated(art,pNVar9,deprecated_prefix_allocator);
          uVar11 = uVar11 + 1;
          pNVar9 = pNVar9 + 1;
        } while (uVar11 < *pbVar10);
      }
      break;
    case NODE_48:
      paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar3->_M_elems[4].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar11 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar7 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar7[1]; plVar7 = (long *)*plVar7) {
        plVar6 = plVar7;
      }
      lVar12 = *plVar6;
      pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(lVar12 + 0x10));
      bVar2 = BufferHandle::IsValid(&pFVar4->buffer_handle);
      if (bVar2) {
        pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)(lVar12 + 0x10));
        pdVar5 = FixedSizeBuffer::Get(pFVar4,true);
        pdVar5 = pdVar5 + (_Var1._M_head_impl)->bitmask_offset +
                          (ulong)(uVar8 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
      }
      else {
        pdVar5 = (data_ptr_t)0x0;
      }
      if (pdVar5 != (data_ptr_t)0x0) {
        lVar12 = 0;
        do {
          if ((ulong)pdVar5[lVar12 + 1] != 0x30) {
            TransformToDeprecated
                      (art,(Node *)(pdVar5 + (ulong)pdVar5[lVar12 + 1] * 8 + 0x108),
                       deprecated_prefix_allocator);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x100);
      }
      break;
    case NODE_256:
      paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar3->_M_elems[5].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar11 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar7 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar7[1]; plVar7 = (long *)*plVar7) {
        plVar6 = plVar7;
      }
      lVar12 = *plVar6;
      pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(lVar12 + 0x10));
      bVar2 = BufferHandle::IsValid(&pFVar4->buffer_handle);
      if (bVar2) {
        pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)(lVar12 + 0x10));
        pdVar5 = FixedSizeBuffer::Get(pFVar4,true);
        pdVar5 = pdVar5 + (_Var1._M_head_impl)->bitmask_offset +
                          (ulong)(uVar8 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
      }
      else {
        pdVar5 = (data_ptr_t)0x0;
      }
      if (pdVar5 != (data_ptr_t)0x0) {
        lVar12 = 0;
        do {
          if (pdVar5[lVar12 + 0xf] != '\0') {
            TransformToDeprecated(art,(Node *)(pdVar5 + lVar12 + 8),deprecated_prefix_allocator);
          }
          lVar12 = lVar12 + 8;
        } while (lVar12 != 0x800);
      }
      break;
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"invalid node type for TransformToDeprecated: %s","");
      EnumUtil::ToString<duckdb::NType>(&local_50,value);
      InternalException::InternalException<std::__cxx11::string>(this,&local_70,&local_50);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    return;
  }
  Leaf::TransformToDeprecated(art,node);
  return;
}

Assistant:

void Node::TransformToDeprecated(ART &art, Node &node,
                                 unsafe_unique_ptr<FixedSizeAllocator> &deprecated_prefix_allocator) {
	D_ASSERT(node.HasMetadata());

	if (node.GetGateStatus() == GateStatus::GATE_SET) {
		D_ASSERT(node.GetType() != NType::LEAF_INLINED);
		return Leaf::TransformToDeprecated(art, node);
	}

	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::TransformToDeprecated(art, node, deprecated_prefix_allocator);
	case NType::LEAF_INLINED:
		return;
	case NType::LEAF:
		return;
	case NType::NODE_4:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node4>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_16:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node16>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_48:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node48>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_256:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node256>(art, node, type), deprecated_prefix_allocator);
	default:
		throw InternalException("invalid node type for TransformToDeprecated: %s", EnumUtil::ToString(type));
	}
}